

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  App example;
  stringstream str;
  _Any_data local_1d0;
  _Manager_type local_1c0;
  _Invoker_type local_1b8;
  long *local_1b0 [2];
  long local_1a0 [2];
  stringstream local_190 [16];
  basic_ostream<char,_std::char_traits<char>_> local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Drawable,_Square,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<App,_0>((App *)&local_1d0,
                   (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Drawable,_Square,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
                    *)local_1b0);
  if (local_1c0 == (code *)0x0) {
    std::__throw_bad_function_call();
  }
  else {
    (*local_1b8)(&local_1d0,local_180);
    std::__cxx11::stringbuf::str();
    iVar1 = std::__cxx11::string::compare((char *)local_1b0);
    if (iVar1 == 0) {
      if (local_1b0[0] != local_1a0) {
        operator_delete(local_1b0[0],local_1a0[0] + 1);
      }
      if (local_1c0 != (code *)0x0) {
        (*local_1c0)(&local_1d0,&local_1d0,__destroy_functor);
      }
      std::__cxx11::stringstream::~stringstream(local_190);
      std::ios_base::~ios_base(local_110);
      return 0;
    }
  }
  __assert_fail("\"Square\" == str.str()",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/polymorphism/function.cpp"
                ,0x2a,"int main()");
}

Assistant:

int main() {
  std::stringstream str{};
  auto example = config().create<App>();
  example.draw(str);
  assert("Square" == str.str());
}